

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Mesh(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uint local_40;
  int fVerbose;
  int c;
  int fUseSatoko;
  int T;
  int Y;
  int X;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  T = 4;
  fUseSatoko = 4;
  c = 3;
  bVar1 = true;
  local_40 = 1;
  Extra_UtilGetoptReset();
LAB_002bb07d:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"XYTsh");
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Mesh(): There is no design.\n");
        return 1;
      }
      iVar2 = Gia_ManCoNum(pAbc->pGia);
      if (iVar2 != 1) {
        Abc_Print(-1,"Currently this command expects AIG with one output.\n");
        return 1;
      }
      iVar2 = Gia_ManCiNum(pAbc->pGia);
      if (0x14 < iVar2) {
        Abc_Print(-1,"Currently this command expects AIG with no more than 20 nodes.\n");
        return 1;
      }
      iVar2 = Gia_ManLevelNum(pAbc->pGia);
      if (c < iVar2) {
        uVar3 = Gia_ManLevelNum(pAbc->pGia);
        Abc_Print(-1,"The depth of the AIG (%d) cannot be larger than the latency (%d).\n",
                  (ulong)uVar3,(ulong)(uint)c);
        return 1;
      }
      if (bVar1) {
        Bmc_MeshTest(pAbc->pGia,T,fUseSatoko,c,local_40);
      }
      else {
        Bmc_MeshTest2(pAbc->pGia,T,fUseSatoko,c,local_40);
      }
      return 0;
    }
    switch(iVar2) {
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002bb342;
      }
      c = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (c < 2) goto LAB_002bb342;
      goto LAB_002bb07d;
    default:
      goto LAB_002bb342;
    case 0x58:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-X\" should be followed by an integer.\n");
        goto LAB_002bb342;
      }
      T = atoi(argv[globalUtilOptind]);
      iVar2 = T;
      break;
    case 0x59:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-Y\" should be followed by an integer.\n");
        goto LAB_002bb342;
      }
      fUseSatoko = atoi(argv[globalUtilOptind]);
      iVar2 = fUseSatoko;
      break;
    case 0x68:
      goto LAB_002bb342;
    case 0x73:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_002bb07d;
    case 0x76:
      local_40 = local_40 ^ 1;
      goto LAB_002bb07d;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 3) {
LAB_002bb342:
      Abc_Print(-2,"usage: &mesh [-XYT num] [-sh]\n");
      Abc_Print(-2,"\t         creates a mesh architecture for the given AIG\n");
      Abc_Print(-2,"\t-X num : horizontal size of the mesh (X >= 3) [default = %d]\n",(ulong)(uint)T
               );
      Abc_Print(-2,"\t-Y num : vertical size of the mesh (Y >= 3) [default = %d]\n",
                (ulong)(uint)fUseSatoko);
      Abc_Print(-2,"\t-T num : the latency of the mesh (T >= 2) [default = %d]\n",(ulong)(uint)c);
      pcVar4 = "no";
      if (bVar1) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle using new SAT solver Satoko [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (local_40 != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Mesh( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Bmc_MeshTest( Gia_Man_t * p, int X, int Y, int T, int fVerbose );
    extern void Bmc_MeshTest2( Gia_Man_t * p, int X, int Y, int T, int fVerbose );
    int X =  4;
    int Y =  4;
    int T =  3;
    int fUseSatoko = 1;
    int c, fVerbose = 1;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "XYTsh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'X':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-X\" should be followed by an integer.\n" );
                goto usage;
            }
            X = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( X < 3 )
                goto usage;
            break;
        case 'Y':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Y\" should be followed by an integer.\n" );
                goto usage;
            }
            Y = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Y < 3 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            T = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( T < 2 )
                goto usage;
            break;
        case 's':
            fUseSatoko ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Mesh(): There is no design.\n" );
        return 1;
    }
    if ( Gia_ManCoNum(pAbc->pGia) != 1 )
    {
        Abc_Print( -1, "Currently this command expects AIG with one output.\n" );
        return 1;
    }
    if ( Gia_ManCiNum(pAbc->pGia) > 20 )
    {
        Abc_Print( -1, "Currently this command expects AIG with no more than 20 nodes.\n" );
        return 1;
    }
    if ( Gia_ManLevelNum(pAbc->pGia) > T )
    {
        Abc_Print( -1, "The depth of the AIG (%d) cannot be larger than the latency (%d).\n", Gia_ManLevelNum(pAbc->pGia), T );
        return 1;
    }
    if ( fUseSatoko )
        Bmc_MeshTest( pAbc->pGia, X, Y, T, fVerbose );
    else
        Bmc_MeshTest2( pAbc->pGia, X, Y, T, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &mesh [-XYT num] [-sh]\n" );
    Abc_Print( -2, "\t         creates a mesh architecture for the given AIG\n" );
    Abc_Print( -2, "\t-X num : horizontal size of the mesh (X >= 3) [default = %d]\n", X );
    Abc_Print( -2, "\t-Y num : vertical size of the mesh (Y >= 3) [default = %d]\n", Y );
    Abc_Print( -2, "\t-T num : the latency of the mesh (T >= 2) [default = %d]\n", T );
    Abc_Print( -2, "\t-s     : toggle using new SAT solver Satoko [default = %s]\n", fUseSatoko? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}